

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpaintengine_raster.cpp
# Opt level: O1

Format __thiscall QRasterBuffer::prepare(QRasterBuffer *this,QImage *image)

{
  uint uVar1;
  undefined8 uVar2;
  int iVar3;
  int iVar4;
  Format FVar5;
  uchar *puVar6;
  qsizetype qVar7;
  uint uVar8;
  uint uVar9;
  long in_FS_OFFSET;
  bool bVar10;
  QColorSpace moved;
  undefined1 local_58 [16];
  QImageData *local_48;
  QList<unsigned_int> local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  puVar6 = QImage::bits(image);
  this->m_buffer = puVar6;
  iVar3 = QImage::width(image);
  if (0x7ffffe < iVar3) {
    iVar3 = 0x7fffff;
  }
  this->m_width = iVar3;
  iVar4 = QImage::height(image);
  iVar3 = 0x7fffff;
  if (iVar4 < 0x7fffff) {
    iVar3 = iVar4;
  }
  this->m_height = iVar3;
  iVar4 = QImage::depth(image);
  iVar3 = iVar4 + 7;
  if (-1 < iVar4) {
    iVar3 = iVar4;
  }
  this->bytes_per_pixel = iVar3 >> 3;
  qVar7 = QImage::bytesPerLine(image);
  this->bytes_per_line = qVar7;
  FVar5 = QImage::format(image);
  this->format = FVar5;
  QImage::colorSpace((QImage *)local_58);
  uVar2 = local_58._0_8_;
  local_58._0_8_ = (totally_ordered_wrapper<QColorSpacePrivate_*>)0x0;
  local_40.d.d = (Data *)(this->colorSpace).d_ptr.d.ptr;
  (this->colorSpace).d_ptr.d.ptr = (QColorSpacePrivate *)uVar2;
  QColorSpace::~QColorSpace((QColorSpace *)&local_40);
  QColorSpace::~QColorSpace((QColorSpace *)local_58);
  iVar3 = QImage::depth(image);
  if (iVar3 == 1) {
    QImage::colorTable(&local_40,image);
    bVar10 = local_40.d.size == 2;
    if ((QColorSpacePrivate *)local_40.d.d != (QColorSpacePrivate *)0x0) {
      LOCK();
      (((QSharedData *)&(local_40.d.d)->super_QArrayData)->ref).super_QAtomicInteger<int>.
      super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> =
           (__atomic_base<int>)
           ((__int_type)
            (((QSharedData *)&(local_40.d.d)->super_QArrayData)->ref).super_QAtomicInteger<int>.
            super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> + -1);
      UNLOCK();
      if ((__int_type)
          (((QSharedData *)&(local_40.d.d)->super_QArrayData)->ref).super_QAtomicInteger<int>.
          super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> == 0) {
        QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,4,0x10);
      }
    }
  }
  else {
    bVar10 = false;
  }
  if (bVar10) {
    this->monoDestinationWithClut = true;
    local_48 = (QImageData *)&DAT_aaaaaaaaaaaaaaaa;
    local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QImage::colorTable((QList<unsigned_int> *)local_58,image);
    uVar1 = *(uint *)local_58._8_8_;
    uVar9 = (uVar1 & 0xff00ff) * (uVar1 >> 0x18);
    uVar8 = (uVar1 >> 8 & 0xff) * (uVar1 >> 0x18);
    this->destColor0 =
         uVar1 & 0xff000000 | uVar8 + 0x80 + (uVar8 >> 8) & 0xff00 |
         uVar9 + 0x800080 + (uVar9 >> 8 & 0xff00ff) >> 8 & 0xff00ff;
    uVar1 = *(uint *)(local_58._8_8_ + 4);
    uVar9 = (uVar1 & 0xff00ff) * (uVar1 >> 0x18);
    uVar8 = (uVar1 >> 8 & 0xff) * (uVar1 >> 0x18);
    this->destColor1 =
         uVar1 & 0xff000000 | uVar8 + 0x80 + (uVar8 >> 8) & 0xff00 |
         uVar9 + 0x800080 + (uVar9 >> 8 & 0xff00ff) >> 8 & 0xff00ff;
    if ((QColorSpacePrivate *)local_58._0_8_ != (QColorSpacePrivate *)0x0) {
      LOCK();
      *(int *)local_58._0_8_ = *(int *)local_58._0_8_ + -1;
      UNLOCK();
      if (*(int *)local_58._0_8_ == 0) {
        QArrayData::deallocate((QArrayData *)local_58._0_8_,4,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return this->format;
}

Assistant:

QImage::Format QRasterBuffer::prepare(QImage *image)
{
    m_buffer = (uchar *)image->bits();
    m_width = qMin(QT_RASTER_COORD_LIMIT, image->width());
    m_height = qMin(QT_RASTER_COORD_LIMIT, image->height());
    bytes_per_pixel = image->depth()/8;
    bytes_per_line = image->bytesPerLine();

    format = image->format();
    colorSpace = image->colorSpace();
    if (image->depth() == 1 && image->colorTable().size() == 2) {
        monoDestinationWithClut = true;
        const QList<QRgb> colorTable = image->colorTable();
        destColor0 = qPremultiply(colorTable[0]);
        destColor1 = qPremultiply(colorTable[1]);
    }

    return format;
}